

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internals.h
# Opt level: O0

uint32_t arm_fi_to_lfsc(ARMMMUFaultInfo_conflict1 *fi)

{
  uint local_1c;
  uint32_t fsc;
  ARMMMUFaultInfo_conflict1 *fi_local;
  
  switch(fi->type) {
  case ARMFault_None:
    return 0;
  case ARMFault_AccessFlag:
    local_1c = fi->level & 3U | 8;
    break;
  case ARMFault_Alignment:
    local_1c = 0x21;
    break;
  default:
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/internals.h"
               ,0x2e8,(char *)0x0);
  case ARMFault_Permission:
    local_1c = fi->level & 3U | 0xc;
    break;
  case ARMFault_Translation:
    local_1c = fi->level & 3U | 4;
    break;
  case ARMFault_AddressSize:
    local_1c = fi->level & 3;
    break;
  case ARMFault_SyncExternal:
    local_1c = (uint)(fi->ea & 1) << 0xc | 0x10;
    break;
  case ARMFault_SyncExternalOnWalk:
    local_1c = fi->level & 3U | 0x14 | (uint)(fi->ea & 1) << 0xc;
    break;
  case ARMFault_SyncParity:
    local_1c = 0x18;
    break;
  case ARMFault_SyncParityOnWalk:
    local_1c = fi->level & 3U | 0x1c;
    break;
  case ARMFault_AsyncParity:
    local_1c = 0x19;
    break;
  case ARMFault_AsyncExternal:
    local_1c = (uint)(fi->ea & 1) << 0xc | 0x11;
    break;
  case ARMFault_Debug:
    local_1c = 0x22;
    break;
  case ARMFault_TLBConflict:
    local_1c = 0x30;
    break;
  case ARMFault_Lockdown:
    local_1c = 0x34;
    break;
  case ARMFault_Exclusive:
    local_1c = 0x35;
  }
  return local_1c | 0x200;
}

Assistant:

static inline uint32_t arm_fi_to_lfsc(ARMMMUFaultInfo *fi)
{
    uint32_t fsc = 0;

    switch (fi->type) {
    case ARMFault_None:
        return 0;
    case ARMFault_AddressSize:
        fsc = fi->level & 3;
        break;
    case ARMFault_AccessFlag:
        fsc = (fi->level & 3) | (0x2 << 2);
        break;
    case ARMFault_Permission:
        fsc = (fi->level & 3) | (0x3 << 2);
        break;
    case ARMFault_Translation:
        fsc = (fi->level & 3) | (0x1 << 2);
        break;
    case ARMFault_SyncExternal:
        fsc = 0x10 | (fi->ea << 12);
        break;
    case ARMFault_SyncExternalOnWalk:
        fsc = (fi->level & 3) | (0x5 << 2) | (fi->ea << 12);
        break;
    case ARMFault_SyncParity:
        fsc = 0x18;
        break;
    case ARMFault_SyncParityOnWalk:
        fsc = (fi->level & 3) | (0x7 << 2);
        break;
    case ARMFault_AsyncParity:
        fsc = 0x19;
        break;
    case ARMFault_AsyncExternal:
        fsc = 0x11 | (fi->ea << 12);
        break;
    case ARMFault_Alignment:
        fsc = 0x21;
        break;
    case ARMFault_Debug:
        fsc = 0x22;
        break;
    case ARMFault_TLBConflict:
        fsc = 0x30;
        break;
    case ARMFault_Lockdown:
        fsc = 0x34;
        break;
    case ARMFault_Exclusive:
        fsc = 0x35;
        break;
    default:
        /* Other faults can't occur in a context that requires a
         * long-format status code.
         */
        g_assert_not_reached();
        break;
    }

    fsc |= 1 << 9;
    return fsc;
}